

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robotKuka.cpp
# Opt level: O2

void split_pose(Pose pose,double time,RobotKuka *robotKuka)

{
  Pose *this;
  ostream *poVar1;
  int iVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Pose package_speed;
  Pose package_move;
  bool local_69;
  int local_68;
  float local_64;
  Pose local_60;
  Pose local_48;
  
  fVar4 = (float)(int)time / robotKuka->CYCLE_TIME;
  local_68 = (int)fVar4;
  fVar5 = Pose::get_x(&pose);
  fVar14 = (float)(int)fVar4;
  fVar4 = Pose::get_y(&pose);
  fVar6 = Pose::get_z(&pose);
  fVar7 = Pose::get_a(&pose);
  local_64 = Pose::get_b(&pose);
  local_64 = local_64 / fVar14;
  fVar8 = Pose::get_c(&pose);
  Pose::Pose(&local_48,fVar5 / fVar14,fVar4 / fVar14,fVar6 / fVar14,fVar7 / fVar14,local_64,
             fVar8 / fVar14);
  fVar14 = Pose::get_x(&local_48);
  fVar4 = robotKuka->CYCLE_TIME;
  fVar9 = Pose::get_y(&local_48);
  fVar5 = robotKuka->CYCLE_TIME;
  fVar10 = Pose::get_z(&local_48);
  fVar6 = robotKuka->CYCLE_TIME;
  fVar11 = Pose::get_a(&local_48);
  fVar7 = robotKuka->CYCLE_TIME;
  fVar12 = Pose::get_b(&local_48);
  fVar8 = robotKuka->CYCLE_TIME;
  fVar13 = Pose::get_c(&local_48);
  Pose::Pose(&local_60,fVar14 / fVar4,fVar9 / fVar5,fVar10 / fVar6,fVar11 / fVar7,fVar12 / fVar8,
             fVar13 / robotKuka->CYCLE_TIME);
  Pose::print(&local_60);
  this = &robotKuka->security_limit_speed;
  Pose::print(this);
  fVar4 = Pose::get_x(&local_60);
  fVar5 = Pose::get_x(this);
  if (fVar4 <= fVar5) {
    fVar4 = Pose::get_y(&local_60);
    fVar5 = Pose::get_y(this);
    if (fVar4 <= fVar5) {
      fVar4 = Pose::get_z(&local_60);
      fVar5 = Pose::get_z(this);
      if (fVar4 <= fVar5) {
        fVar4 = Pose::get_a(&local_60);
        fVar5 = Pose::get_a(this);
        if (fVar4 <= fVar5) {
          fVar4 = Pose::get_b(&local_60);
          fVar5 = Pose::get_b(this);
          if (fVar4 <= fVar5) {
            fVar4 = Pose::get_c(&local_60);
            fVar5 = Pose::get_c(this);
            if (fVar4 <= fVar5) {
              fVar4 = Pose::get_x(&local_60);
              fVar5 = Pose::get_x(this);
              if (fVar4 <= fVar5 * 0.5) {
                fVar4 = Pose::get_y(&local_60);
                fVar5 = Pose::get_y(this);
                if (fVar4 <= fVar5 * 0.5) {
                  fVar4 = Pose::get_z(&local_60);
                  fVar5 = Pose::get_z(this);
                  if (fVar4 <= fVar5 * 0.5) {
                    fVar4 = Pose::get_a(&local_60);
                    fVar5 = Pose::get_a(this);
                    if (fVar4 <= fVar5 * 0.5) {
                      fVar4 = Pose::get_b(&local_60);
                      fVar5 = Pose::get_b(this);
                      if (fVar4 <= fVar5 * 0.5) {
                        fVar4 = Pose::get_c(&local_60);
                        fVar5 = Pose::get_c(this);
                        if (fVar4 <= fVar5 * 0.5) goto LAB_001066e3;
                      }
                    }
                  }
                }
              }
              poVar1 = std::operator<<((ostream *)&std::cout,
                                       "WARNING | Security: half of security_limit_speed exceeded while planning path. Check the log."
                                      );
              std::endl<char,std::char_traits<char>>(poVar1);
              goto LAB_001066e3;
            }
          }
        }
      }
    }
  }
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "ERROR | Security: security_limit_speed exceeded while planning path. Check the log."
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  robotKuka->communicator_running_flag = &local_69;
LAB_001066e3:
  iVar2 = 0;
  if (0 < local_68) {
    iVar2 = local_68;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    std::deque<Pose,_std::allocator<Pose>_>::push_back(&(robotKuka->move_queue).c,&local_48);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"LOG | ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_68);
  poVar1 = std::operator<<(poVar1," elements pushed to move_queue.");
  std::endl<char,std::char_traits<char>>(poVar1);
  pthread_exit((void *)0x0);
}

Assistant:

void split_pose(Pose pose, double time, RobotKuka* robotKuka)
{
	int packages_ammount = (int) time/robotKuka->CYCLE_TIME;

	Pose package_move(	pose.get_x()/packages_ammount, 
						pose.get_y()/packages_ammount, 
						pose.get_z()/packages_ammount, 
						pose.get_a()/packages_ammount, 
						pose.get_b()/packages_ammount, 
						pose.get_c()/packages_ammount);

	Pose package_speed(	package_move.get_x()/robotKuka->CYCLE_TIME, 
						package_move.get_y()/robotKuka->CYCLE_TIME, 
						package_move.get_z()/robotKuka->CYCLE_TIME, 
						package_move.get_a()/robotKuka->CYCLE_TIME, 
						package_move.get_b()/robotKuka->CYCLE_TIME, 
						package_move.get_c()/robotKuka->CYCLE_TIME);

	package_speed.print();

	robotKuka->security_limit_speed.print();

	if(package_speed.get_x() > robotKuka->security_limit_speed.get_x() || 
	   package_speed.get_y() > robotKuka->security_limit_speed.get_y() || 
	   package_speed.get_z() > robotKuka->security_limit_speed.get_z() || 
	   package_speed.get_a() > robotKuka->security_limit_speed.get_a() || 
	   package_speed.get_b() > robotKuka->security_limit_speed.get_b() || 
	   package_speed.get_c() > robotKuka->security_limit_speed.get_c())
	{
		std::cout << "ERROR | Security: security_limit_speed exceeded while planning path. Check the log." << std::endl;
		robotKuka->stopCommunicator();
	} else if(package_speed.get_x() > robotKuka->security_limit_speed.get_x()/2 || 
	   		  package_speed.get_y() > robotKuka->security_limit_speed.get_y()/2 || 
	   		  package_speed.get_z() > robotKuka->security_limit_speed.get_z()/2 || 
	   		  package_speed.get_a() > robotKuka->security_limit_speed.get_a()/2 || 
	   		  package_speed.get_b() > robotKuka->security_limit_speed.get_b()/2 || 
	   		  package_speed.get_c() > robotKuka->security_limit_speed.get_c()/2)
	{
		std::cout << "WARNING | Security: half of security_limit_speed exceeded while planning path. Check the log." << std::endl;
	}

	for(int i = 0; i < packages_ammount; i++)
	{
		try
		{
			robotKuka->move_queue.push(package_move);
		}
		catch(int e)
		{
			std::cout << "ERROR | Exception: problem while pushing element to move_queue (" << e << ") . Check the log." << std::endl;
		}
	}

	std::cout << "LOG | " << packages_ammount << " elements pushed to move_queue." << std::endl;

	pthread_exit(NULL);
}